

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_history.cpp
# Opt level: O0

void __thiscall libtorrent::aux::timestamp_history::adjust_base(timestamp_history *this,int change)

{
  bool bVar1;
  uint uVar2;
  iterator pvVar3;
  value_type_conflict1 *h;
  iterator __end2;
  iterator __begin2;
  array<unsigned_int,_20UL> *__range2;
  int change_local;
  timestamp_history *this_local;
  
  uVar2 = numeric_cast<unsigned_int,int,void>(change);
  this->m_base = uVar2 + this->m_base;
  __end2 = ::std::array<unsigned_int,_20UL>::begin(&this->m_history);
  pvVar3 = ::std::array<unsigned_int,_20UL>::end(&this->m_history);
  for (; __end2 != pvVar3; __end2 = __end2 + 1) {
    bVar1 = compare_less_wrap(*__end2,this->m_base,0xffffffff);
    if (bVar1) {
      *__end2 = this->m_base;
    }
  }
  return;
}

Assistant:

void timestamp_history::adjust_base(int change)
{
	TORRENT_ASSERT(initialized());
	m_base += aux::numeric_cast<std::uint32_t>(change);
	// make sure this adjustment sticks by updating all history slots
	for (auto& h : m_history)
	{
		if (compare_less_wrap(h, m_base, TIME_MASK))
			h = m_base;
	}
}